

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O3

void cleanup(EVP_PKEY_CTX *ctx)

{
  archive_string *as;
  void *pvVar1;
  void *__ptr;
  
  as = (archive_string *)**(undefined8 **)(ctx + 0x818);
  __ptr = (void *)as[2].buffer_length;
  while (__ptr != (void *)0x0) {
    pvVar1 = *(void **)((long)__ptr + 0x20);
    free(*(void **)((long)__ptr + 0x30));
    free_options(*(mtree_option **)((long)__ptr + 0x28));
    free(__ptr);
    __ptr = pvVar1;
  }
  archive_string_free(as);
  archive_string_free(as + 4);
  archive_string_free(as + 5);
  archive_entry_linkresolver_free((archive_entry_linkresolver *)as[6].s);
  free((void *)as[1].length);
  free(as);
  **(undefined8 **)(ctx + 0x818) = 0;
  return;
}

Assistant:

static void
cleanup(void *data)
{
	struct name_cache *cache = (struct name_cache *)data;
	size_t i;

	if (cache != NULL) {
		for (i = 0; i < cache->size; i++) {
			if (cache->cache[i].name != NULL &&
			    cache->cache[i].name != NO_NAME)
				free((void *)(uintptr_t)cache->cache[i].name);
		}
		free(cache->buff);
		free(cache);
	}
}